

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O2

size_t __thiscall google::protobuf::Reflection::SpaceUsedLong(Reflection *this,Message *message)

{
  ReflectionSchema *this_00;
  FieldDescriptor *field;
  uint uVar1;
  long lVar2;
  bool bVar3;
  CppType CVar4;
  int iVar5;
  UnknownFieldSet *this_01;
  size_t sVar6;
  RepeatedField<int> *pRVar7;
  string *psVar8;
  Message **ppMVar9;
  undefined4 extraout_var;
  long *plVar10;
  ArenaStringPtr *pAVar11;
  MapFieldBase *this_02;
  RepeatedField<bool> *pRVar12;
  RepeatedField<unsigned_long> *pRVar13;
  long lVar14;
  RepeatedPtrFieldBase *pRVar15;
  ulong uVar16;
  int i;
  long lVar17;
  long lVar18;
  size_t local_40;
  
  uVar1 = (this->schema_).object_size_;
  this_01 = GetUnknownFields(this,message);
  local_40 = UnknownFieldSet::SpaceUsedExcludingSelfLong(this_01);
  local_40 = local_40 + uVar1;
  uVar16 = (ulong)(uint)(this->schema_).extensions_offset_;
  if (uVar16 != 0xffffffff) {
    sVar6 = internal::ExtensionSet::SpaceUsedExcludingSelfLong
                      ((ExtensionSet *)
                       ((long)&(message->super_MessageLite)._vptr_MessageLite + uVar16));
    local_40 = local_40 + sVar6;
  }
  this_00 = &this->schema_;
  lVar18 = 0;
  lVar17 = 0;
  do {
    if (this->last_non_weak_field_index_ < lVar17) {
      return local_40;
    }
    lVar2 = *(long *)(this->descriptor_ + 0x28);
    field = (FieldDescriptor *)(lVar2 + lVar18);
    if (*(int *)(lVar2 + 0x3c + lVar18) != 3) {
      if ((*(long *)(lVar2 + 0x58 + lVar18) == 0) ||
         (bVar3 = HasOneofField(this,message,field), bVar3)) {
        CVar4 = FieldDescriptor::cpp_type(field);
        if (CVar4 == CPPTYPE_MESSAGE) {
          if (this_00->default_instance_ != message) {
            ppMVar9 = GetRaw<google::protobuf::Message_const*>(this,message,field);
            if (*ppMVar9 != (Message *)0x0) {
              iVar5 = (*((*ppMVar9)->super_MessageLite)._vptr_MessageLite[0x13])();
              sVar6 = CONCAT44(extraout_var,iVar5);
              goto LAB_0025aff4;
            }
          }
        }
        else if (CVar4 == CPPTYPE_STRING) {
          bVar3 = internal::ReflectionSchema::IsFieldInlined(this_00,field);
          if (bVar3) {
            psVar8 = (string *)
                     GetRaw<google::protobuf::internal::InlinedStringField>(this,message,field);
            sVar6 = internal::StringSpaceUsedExcludingSelfLong(psVar8);
            local_40 = local_40 + sVar6;
          }
          else {
            plVar10 = (long *)internal::ReflectionSchema::GetFieldDefault(this_00,field);
            psVar8 = (string *)*plVar10;
            pAVar11 = GetRaw<google::protobuf::internal::ArenaStringPtr>(this,message,field);
            if (pAVar11->ptr_ != psVar8) {
              sVar6 = internal::StringSpaceUsedExcludingSelfLong(pAVar11->ptr_);
              local_40 = local_40 + sVar6 + 0x20;
            }
          }
        }
      }
      goto switchD_0025ae20_default;
    }
    CVar4 = FieldDescriptor::cpp_type(field);
    switch(CVar4) {
    case CPPTYPE_INT32:
    case CPPTYPE_ENUM:
      pRVar7 = GetRaw<google::protobuf::RepeatedField<int>>(this,message,field);
      break;
    case CPPTYPE_INT64:
      pRVar13 = (RepeatedField<unsigned_long> *)
                GetRaw<google::protobuf::RepeatedField<long>>(this,message,field);
      goto LAB_0025afbb;
    case CPPTYPE_UINT32:
      pRVar7 = (RepeatedField<int> *)
               GetRaw<google::protobuf::RepeatedField<unsigned_int>>(this,message,field);
      break;
    case CPPTYPE_UINT64:
      pRVar13 = GetRaw<google::protobuf::RepeatedField<unsigned_long>>(this,message,field);
      goto LAB_0025afbb;
    case CPPTYPE_DOUBLE:
      pRVar13 = (RepeatedField<unsigned_long> *)
                GetRaw<google::protobuf::RepeatedField<double>>(this,message,field);
LAB_0025afbb:
      lVar14 = (long)pRVar13->total_size_;
      lVar2 = lVar14 * 8;
      goto LAB_0025afeb;
    case CPPTYPE_FLOAT:
      pRVar7 = (RepeatedField<int> *)
               GetRaw<google::protobuf::RepeatedField<float>>(this,message,field);
      break;
    case CPPTYPE_BOOL:
      pRVar12 = GetRaw<google::protobuf::RepeatedField<bool>>(this,message,field);
      uVar16 = (ulong)(pRVar12->total_size_ + 8);
      if (pRVar12->total_size_ < 1) {
        uVar16 = 0;
      }
      local_40 = local_40 + uVar16;
      goto switchD_0025ae20_default;
    case CPPTYPE_STRING:
      pRVar15 = &GetRaw<google::protobuf::RepeatedPtrField<std::__cxx11::string>>
                           (this,message,field)->super_RepeatedPtrFieldBase;
      sVar6 = internal::RepeatedPtrFieldBase::
              SpaceUsedExcludingSelfLong<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                        (pRVar15);
      goto LAB_0025aff4;
    case CPPTYPE_MESSAGE:
      bVar3 = FieldDescriptor::is_map(field);
      if (bVar3) {
        this_02 = GetRaw<google::protobuf::internal::MapFieldBase>(this,message,field);
        sVar6 = internal::MapFieldBase::SpaceUsedExcludingSelfLong(this_02);
      }
      else {
        pRVar15 = GetRaw<google::protobuf::internal::RepeatedPtrFieldBase>(this,message,field);
        sVar6 = internal::RepeatedPtrFieldBase::
                SpaceUsedExcludingSelfLong<google::protobuf::internal::GenericTypeHandler<google::protobuf::Message>>
                          (pRVar15);
      }
      goto LAB_0025aff4;
    default:
      goto switchD_0025ae20_default;
    }
    lVar14 = (long)pRVar7->total_size_;
    lVar2 = lVar14 * 4;
LAB_0025afeb:
    sVar6 = lVar2 + 8;
    if (lVar14 < 1) {
      sVar6 = 0;
    }
LAB_0025aff4:
    local_40 = local_40 + sVar6;
switchD_0025ae20_default:
    lVar17 = lVar17 + 1;
    lVar18 = lVar18 + 0x98;
  } while( true );
}

Assistant:

size_t Reflection::SpaceUsedLong(const Message& message) const {
  // object_size_ already includes the in-memory representation of each field
  // in the message, so we only need to account for additional memory used by
  // the fields.
  size_t total_size = schema_.GetObjectSize();

  total_size += GetUnknownFields(message).SpaceUsedExcludingSelfLong();

  if (schema_.HasExtensionSet()) {
    total_size += GetExtensionSet(message).SpaceUsedExcludingSelfLong();
  }
  for (int i = 0; i <= last_non_weak_field_index_; i++) {
    const FieldDescriptor* field = descriptor_->field(i);
    if (field->is_repeated()) {
      switch (field->cpp_type()) {
#define HANDLE_TYPE(UPPERCASE, LOWERCASE)                           \
  case FieldDescriptor::CPPTYPE_##UPPERCASE:                        \
    total_size += GetRaw<RepeatedField<LOWERCASE> >(message, field) \
                      .SpaceUsedExcludingSelfLong();                \
    break

        HANDLE_TYPE(INT32, int32);
        HANDLE_TYPE(INT64, int64);
        HANDLE_TYPE(UINT32, uint32);
        HANDLE_TYPE(UINT64, uint64);
        HANDLE_TYPE(DOUBLE, double);
        HANDLE_TYPE(FLOAT, float);
        HANDLE_TYPE(BOOL, bool);
        HANDLE_TYPE(ENUM, int);
#undef HANDLE_TYPE

        case FieldDescriptor::CPPTYPE_STRING:
          switch (field->options().ctype()) {
            default:  // TODO(kenton):  Support other string reps.
            case FieldOptions::STRING:
              total_size +=
                  GetRaw<RepeatedPtrField<std::string> >(message, field)
                      .SpaceUsedExcludingSelfLong();
              break;
          }
          break;

        case FieldDescriptor::CPPTYPE_MESSAGE:
          if (IsMapFieldInApi(field)) {
            total_size += GetRaw<internal::MapFieldBase>(message, field)
                              .SpaceUsedExcludingSelfLong();
          } else {
            // We don't know which subclass of RepeatedPtrFieldBase the type is,
            // so we use RepeatedPtrFieldBase directly.
            total_size +=
                GetRaw<RepeatedPtrFieldBase>(message, field)
                    .SpaceUsedExcludingSelfLong<GenericTypeHandler<Message> >();
          }

          break;
      }
    } else {
      if (field->containing_oneof() && !HasOneofField(message, field)) {
        continue;
      }
      switch (field->cpp_type()) {
        case FieldDescriptor::CPPTYPE_INT32:
        case FieldDescriptor::CPPTYPE_INT64:
        case FieldDescriptor::CPPTYPE_UINT32:
        case FieldDescriptor::CPPTYPE_UINT64:
        case FieldDescriptor::CPPTYPE_DOUBLE:
        case FieldDescriptor::CPPTYPE_FLOAT:
        case FieldDescriptor::CPPTYPE_BOOL:
        case FieldDescriptor::CPPTYPE_ENUM:
          // Field is inline, so we've already counted it.
          break;

        case FieldDescriptor::CPPTYPE_STRING: {
          switch (field->options().ctype()) {
            default:  // TODO(kenton):  Support other string reps.
            case FieldOptions::STRING: {
              if (IsInlined(field)) {
                const std::string* ptr =
                    &GetField<InlinedStringField>(message, field).GetNoArena();
                total_size += StringSpaceUsedExcludingSelfLong(*ptr);
                break;
              }

              // Initially, the string points to the default value stored
              // in the prototype. Only count the string if it has been
              // changed from the default value.
              const std::string* default_ptr =
                  &DefaultRaw<ArenaStringPtr>(field).Get();
              const std::string* ptr =
                  &GetField<ArenaStringPtr>(message, field).Get();

              if (ptr != default_ptr) {
                // string fields are represented by just a pointer, so also
                // include sizeof(string) as well.
                total_size +=
                    sizeof(*ptr) + StringSpaceUsedExcludingSelfLong(*ptr);
              }
              break;
            }
          }
          break;
        }

        case FieldDescriptor::CPPTYPE_MESSAGE:
          if (schema_.IsDefaultInstance(message)) {
            // For singular fields, the prototype just stores a pointer to the
            // external type's prototype, so there is no extra memory usage.
          } else {
            const Message* sub_message = GetRaw<const Message*>(message, field);
            if (sub_message != nullptr) {
              total_size += sub_message->SpaceUsedLong();
            }
          }
          break;
      }
    }
  }
  return total_size;
}